

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::Tables::CheckPoint::CheckPoint(CheckPoint *this,Tables *tables)

{
  size_type sVar1;
  Tables *tables_local;
  CheckPoint *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
          ::size(&tables->strings_);
  this->strings_before_checkpoint = (int)sVar1;
  sVar1 = std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::
          size(&tables->messages_);
  this->messages_before_checkpoint = (int)sVar1;
  sVar1 = std::
          vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
          ::size(&tables->once_dynamics_);
  this->once_dynamics_before_checkpoint = (int)sVar1;
  sVar1 = std::
          vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
          ::size(&tables->file_tables_);
  this->file_tables_before_checkpoint = (int)sVar1;
  sVar1 = std::vector<void_*,_std::allocator<void_*>_>::size(&tables->allocations_);
  this->allocations_before_checkpoint = (int)sVar1;
  sVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                    (&tables->symbols_after_checkpoint_);
  this->pending_symbols_before_checkpoint = (int)sVar1;
  sVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                    (&tables->files_after_checkpoint_);
  this->pending_files_before_checkpoint = (int)sVar1;
  sVar1 = std::
          vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
          ::size(&tables->extensions_after_checkpoint_);
  this->pending_extensions_before_checkpoint = (int)sVar1;
  return;
}

Assistant:

explicit CheckPoint(const Tables* tables)
        : strings_before_checkpoint(tables->strings_.size()),
          messages_before_checkpoint(tables->messages_.size()),
          once_dynamics_before_checkpoint(tables->once_dynamics_.size()),
          file_tables_before_checkpoint(tables->file_tables_.size()),
          allocations_before_checkpoint(tables->allocations_.size()),
          pending_symbols_before_checkpoint(
              tables->symbols_after_checkpoint_.size()),
          pending_files_before_checkpoint(
              tables->files_after_checkpoint_.size()),
          pending_extensions_before_checkpoint(
              tables->extensions_after_checkpoint_.size()) {}